

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O1

FT_Error FT_Bitmap_Embolden(FT_Library library,FT_Bitmap *bitmap,FT_Pos xStrength,FT_Pos yStrength)

{
  uchar *puVar1;
  byte bVar2;
  int iVar3;
  FT_Memory memory;
  FT_Error FVar4;
  uint uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  byte bVar11;
  FT_UInt count;
  uint uVar12;
  uchar *__src;
  byte *__s;
  uchar *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  byte *pbVar17;
  ulong uVar18;
  byte *pbVar19;
  uchar *puVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  FT_Bitmap tmp;
  FT_Bitmap local_58;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (bitmap == (FT_Bitmap *)0x0) {
    return 6;
  }
  if (bitmap->buffer == (uchar *)0x0) {
    return 6;
  }
  if (0x1fffffffdf < yStrength || 0x1fffffffdf < xStrength) {
    return 6;
  }
  uVar21 = (int)xStrength + 0x20;
  uVar8 = (int)yStrength + 0x20;
  if ((uVar8 | uVar21) < 0x40) {
    return 0;
  }
  iVar22 = (int)uVar21 >> 6;
  iVar9 = (int)uVar8 >> 6;
  if ((int)(uVar8 | uVar21) >> 6 < 0) {
    return 6;
  }
  iVar23 = iVar22;
  switch(bitmap->pixel_mode) {
  case '\x01':
    iVar23 = 8;
    if (iVar22 < 8) {
      iVar23 = iVar22;
    }
    break;
  case '\x03':
  case '\x04':
    local_58.buffer = (uchar *)0x0;
    local_58.num_grays = 0;
    local_58.pixel_mode = '\0';
    local_58.palette_mode = '\0';
    local_58._28_4_ = 0;
    local_58.rows = 0;
    local_58.width = 0;
    local_58.pitch = 0;
    local_58._12_4_ = 0;
    local_58.palette = (void *)0x0;
    FVar4 = FT_Bitmap_Convert(library,bitmap,&local_58,1);
    if (FVar4 != 0) {
      return FVar4;
    }
    ft_mem_free(library->memory,bitmap->buffer);
    bitmap->palette = local_58.palette;
    bitmap->buffer = local_58.buffer;
    bitmap->num_grays = local_58.num_grays;
    bitmap->pixel_mode = local_58.pixel_mode;
    bitmap->palette_mode = local_58.palette_mode;
    *(undefined4 *)&bitmap->field_0x1c = local_58._28_4_;
    bitmap->rows = local_58.rows;
    bitmap->width = local_58.width;
    bitmap->pitch = local_58.pitch;
    *(undefined4 *)&bitmap->field_0xc = local_58._12_4_;
    break;
  case '\x05':
    iVar23 = iVar22 * 3;
    break;
  case '\x06':
    iVar9 = iVar9 * 3;
    break;
  case '\a':
    goto LAB_001867b8;
  }
  uVar8 = bitmap->pitch;
  uVar14 = -uVar8;
  uVar21 = uVar8;
  if ((int)uVar8 < 1) {
    uVar21 = uVar14;
  }
  if (bitmap->pixel_mode - 1 < 6) {
    uVar5 = bitmap->width;
    switch((uint)bitmap->pixel_mode) {
    case 1:
      uVar16 = uVar5 + iVar23 + 7 >> 3;
      iVar22 = 1;
      break;
    default:
      uVar16 = uVar5 + iVar23;
      iVar22 = 8;
      break;
    case 3:
      uVar16 = uVar5 + iVar23 + 3 >> 2;
      iVar22 = 2;
      break;
    case 4:
      uVar16 = uVar5 + iVar23 + 1 >> 1;
      iVar22 = 4;
    }
    memory = library->memory;
    uVar12 = bitmap->rows;
    if ((iVar9 == 0) && (uVar16 <= uVar21)) {
      uVar5 = iVar22 * (uVar5 + iVar23);
      uVar15 = 0;
      if ((uVar5 < uVar21 * 8) && (uVar12 != 0)) {
        pbVar10 = bitmap->buffer + (uVar5 >> 3);
        if (uVar8 != uVar14 && SBORROW4(uVar8,uVar14) == (int)(uVar8 * 2) < 0) {
          uVar14 = uVar8;
        }
        pbVar17 = bitmap->buffer + uVar14;
        pbVar19 = pbVar17;
        do {
          __s = pbVar10;
          if ((uVar5 & 7) != 0) {
            *pbVar10 = *pbVar10 & (byte)(0xff00 >> ((byte)uVar5 & 7));
            __s = pbVar10 + 1;
          }
          if (__s < pbVar17) {
            memset(__s,0,(long)pbVar19 - (long)__s);
          }
          pbVar10 = pbVar10 + uVar21;
          pbVar19 = pbVar19 + uVar14;
          pbVar17 = pbVar17 + uVar14;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
LAB_001867ad:
        uVar15 = 0;
      }
    }
    else {
      puVar13 = (uchar *)ft_mem_qrealloc(memory,(ulong)uVar16,0,(ulong)(uVar12 + iVar9),(void *)0x0,
                                         (FT_Error *)&local_58);
      uVar15 = local_58.rows;
      if (local_58.rows == 0) {
        __src = bitmap->buffer;
        uVar8 = bitmap->rows * uVar21;
        puVar1 = __src + uVar8;
        if (bitmap->pitch < 1) {
          puVar20 = puVar13;
          if (uVar8 != 0) {
            do {
              memcpy(puVar20,__src,(ulong)(iVar22 * uVar5 + 7 >> 3));
              __src = __src + uVar21;
              memset(puVar20 + uVar21,0,(ulong)(uVar16 - uVar21));
              puVar20 = puVar20 + uVar21 + (uVar16 - uVar21);
            } while (__src < puVar1);
          }
          memset(puVar20,0,(ulong)(uVar16 * iVar9));
        }
        else {
          memset(puVar13,0,(ulong)(uVar16 * iVar9));
          if (uVar8 != 0) {
            puVar20 = puVar13 + uVar16 * iVar9;
            do {
              memcpy(puVar20,__src,(ulong)(iVar22 * uVar5 + 7 >> 3));
              __src = __src + uVar21;
              memset(puVar20 + uVar21,0,(ulong)(uVar16 - uVar21));
              puVar20 = puVar20 + uVar21 + (uVar16 - uVar21);
            } while (__src < puVar1);
          }
        }
        ft_mem_free(memory,bitmap->buffer);
        bitmap->buffer = puVar13;
        uVar8 = -uVar16;
        if (-1 < bitmap->pitch) {
          uVar8 = uVar16;
        }
        bitmap->pitch = uVar8;
        goto LAB_001867ad;
      }
    }
  }
  else {
    uVar15 = 0x12;
  }
  if (uVar15 != 0) {
    return uVar15;
  }
  uVar8 = bitmap->pitch;
  if ((int)uVar8 < 1) {
    uVar8 = -uVar8;
    uVar21 = (bitmap->rows - 1) * uVar8;
  }
  else {
    uVar21 = uVar8 * iVar9;
  }
  uVar14 = bitmap->rows;
  if (uVar14 != 0) {
    puVar13 = bitmap->buffer + uVar21;
    uVar21 = 0;
    do {
      uVar7 = (ulong)uVar8;
      uVar14 = uVar8 - 2;
      if (0 < (int)uVar8) {
        do {
          uVar18 = uVar7 - 1;
          if (0 < iVar23) {
            bVar2 = puVar13[uVar7 - 1];
            iVar22 = 1;
            bVar6 = 7;
            uVar15 = uVar14;
            do {
              if (bitmap->pixel_mode == '\x01') {
                bVar11 = bVar2 >> ((byte)iVar22 & 0x1f) | puVar13[uVar7 - 1];
                puVar13[uVar7 - 1] = bVar11;
                if (uVar7 != 1) {
                  puVar13[uVar7 - 1] = bVar11 | puVar13[uVar7 - 2] << (bVar6 & 0x1f);
                }
              }
              else {
                if ((int)uVar15 < 0) break;
                uVar5 = (uint)puVar13[uVar15] + (uint)puVar13[uVar18];
                if (bitmap->num_grays <= uVar5) {
                  puVar13[uVar18] = (char)bitmap->num_grays + 0xff;
                  break;
                }
                puVar13[uVar18] = (uchar)uVar5;
                if ((uVar5 & 0xff) == bitmap->num_grays - 1) break;
              }
              if (iVar23 <= iVar22) break;
              iVar22 = iVar22 + 1;
              uVar15 = uVar15 - 1;
              bVar6 = bVar6 - 1;
            } while( true );
          }
          uVar14 = uVar14 - 1;
          bVar24 = 1 < (long)uVar7;
          uVar7 = uVar18;
        } while (bVar24);
      }
      if (0 < iVar9) {
        iVar22 = 1;
        do {
          if (0 < (int)uVar8) {
            iVar3 = bitmap->pitch;
            uVar7 = 0;
            do {
              puVar13[uVar7 - (long)(iVar3 * iVar22)] =
                   puVar13[uVar7 - (long)(iVar3 * iVar22)] | puVar13[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
          bVar24 = iVar22 != iVar9;
          iVar22 = iVar22 + 1;
        } while (bVar24);
      }
      puVar13 = puVar13 + bitmap->pitch;
      uVar21 = uVar21 + 1;
      uVar14 = bitmap->rows;
    } while (uVar21 < uVar14);
  }
  bitmap->width = bitmap->width + iVar23;
  bitmap->rows = uVar14 + iVar9;
LAB_001867b8:
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Embolden( FT_Library  library,
                      FT_Bitmap*  bitmap,
                      FT_Pos      xStrength,
                      FT_Pos      yStrength )
  {
    FT_Error        error;
    unsigned char*  p;
    FT_Int          i, x, pitch;
    FT_UInt         y;
    FT_Int          xstr, ystr;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !bitmap || !bitmap->buffer )
      return FT_THROW( Invalid_Argument );

    if ( ( ( FT_PIX_ROUND( xStrength ) >> 6 ) > FT_INT_MAX ) ||
         ( ( FT_PIX_ROUND( yStrength ) >> 6 ) > FT_INT_MAX ) )
      return FT_THROW( Invalid_Argument );

    xstr = (FT_Int)FT_PIX_ROUND( xStrength ) >> 6;
    ystr = (FT_Int)FT_PIX_ROUND( yStrength ) >> 6;

    if ( xstr == 0 && ystr == 0 )
      return FT_Err_Ok;
    else if ( xstr < 0 || ystr < 0 )
      return FT_THROW( Invalid_Argument );

    switch ( bitmap->pixel_mode )
    {
    case FT_PIXEL_MODE_GRAY2:
    case FT_PIXEL_MODE_GRAY4:
      {
        FT_Bitmap  tmp;


        /* convert to 8bpp */
        FT_Bitmap_Init( &tmp );
        error = FT_Bitmap_Convert( library, bitmap, &tmp, 1 );
        if ( error )
          return error;

        FT_Bitmap_Done( library, bitmap );
        *bitmap = tmp;
      }
      break;

    case FT_PIXEL_MODE_MONO:
      if ( xstr > 8 )
        xstr = 8;
      break;

    case FT_PIXEL_MODE_LCD:
      xstr *= 3;
      break;

    case FT_PIXEL_MODE_LCD_V:
      ystr *= 3;
      break;

    case FT_PIXEL_MODE_BGRA:
      /* We don't embolden color glyphs. */
      return FT_Err_Ok;
    }

    error = ft_bitmap_assure_buffer( library->memory, bitmap,
                                     (FT_UInt)xstr, (FT_UInt)ystr );
    if ( error )
      return error;

    /* take care of bitmap flow */
    pitch = bitmap->pitch;
    if ( pitch > 0 )
      p = bitmap->buffer + pitch * ystr;
    else
    {
      pitch = -pitch;
      p = bitmap->buffer + (FT_UInt)pitch * ( bitmap->rows - 1 );
    }

    /* for each row */
    for ( y = 0; y < bitmap->rows; y++ )
    {
      /*
       * Horizontally:
       *
       * From the last pixel on, make each pixel or'ed with the
       * `xstr' pixels before it.
       */
      for ( x = pitch - 1; x >= 0; x-- )
      {
        unsigned char  tmp;


        tmp = p[x];
        for ( i = 1; i <= xstr; i++ )
        {
          if ( bitmap->pixel_mode == FT_PIXEL_MODE_MONO )
          {
            p[x] |= tmp >> i;

            /* the maximum value of 8 for `xstr' comes from here */
            if ( x > 0 )
              p[x] |= p[x - 1] << ( 8 - i );

#if 0
            if ( p[x] == 0xFF )
              break;
#endif
          }
          else
          {
            if ( x - i >= 0 )
            {
              if ( p[x] + p[x - i] > bitmap->num_grays - 1 )
              {
                p[x] = (unsigned char)( bitmap->num_grays - 1 );
                break;
              }
              else
              {
                p[x] = (unsigned char)( p[x] + p[x - i] );
                if ( p[x] == bitmap->num_grays - 1 )
                  break;
              }
            }
            else
              break;
          }
        }
      }

      /*
       * Vertically:
       *
       * Make the above `ystr' rows or'ed with it.
       */
      for ( x = 1; x <= ystr; x++ )
      {
        unsigned char*  q;


        q = p - bitmap->pitch * x;
        for ( i = 0; i < pitch; i++ )
          q[i] |= p[i];
      }

      p += bitmap->pitch;
    }

    bitmap->width += (FT_UInt)xstr;
    bitmap->rows += (FT_UInt)ystr;

    return FT_Err_Ok;
  }